

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O2

ze_result_t driver::zetDebugInterrupt(zet_debug_session_handle_t hDebug,ze_device_thread_t thread)

{
  ze_result_t zVar1;
  
  if (DAT_0010d940 != (code *)0x0) {
    zVar1 = (*DAT_0010d940)(hDebug,thread._0_8_,thread._8_8_);
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugInterrupt(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread                       ///< [in] the thread to interrupt
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnInterrupt = context.zetDdiTable.Debug.pfnInterrupt;
        if( nullptr != pfnInterrupt )
        {
            result = pfnInterrupt( hDebug, thread );
        }
        else
        {
            // generic implementation
        }

        return result;
    }